

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O2

void * __thiscall lan::db::get_var_data(db *this,db_bit_type type,string *data)

{
  int iVar1;
  string *__return_storage_ptr__;
  string *this_00;
  double dVar2;
  pointer pcVar3;
  string sStack_78;
  string local_58;
  string local_38;
  
  this_00 = &sStack_78;
  switch(type) {
  case Bool:
    __return_storage_ptr__ = (string *)operator_new(1);
    iVar1 = atoi((data->_M_dataplus)._M_p);
    *(bool *)&(__return_storage_ptr__->_M_dataplus)._M_p = iVar1 != 0;
    break;
  case Int:
    __return_storage_ptr__ = (string *)operator_new(4);
    iVar1 = atoi((data->_M_dataplus)._M_p);
    *(int *)&(__return_storage_ptr__->_M_dataplus)._M_p = iVar1;
    break;
  case Long:
    __return_storage_ptr__ = (string *)operator_new(8);
    pcVar3 = (pointer)atol((data->_M_dataplus)._M_p);
    goto LAB_00106a84;
  case LongLong:
    __return_storage_ptr__ = (string *)operator_new(8);
    pcVar3 = (pointer)atoll((data->_M_dataplus)._M_p);
LAB_00106a84:
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    break;
  case Float:
    __return_storage_ptr__ = (string *)operator_new(4);
    dVar2 = atof((data->_M_dataplus)._M_p);
    *(float *)&(__return_storage_ptr__->_M_dataplus)._M_p = (float)dVar2;
    break;
  case Double:
    __return_storage_ptr__ = (string *)operator_new(8);
    pcVar3 = (pointer)strtod((data->_M_dataplus)._M_p,(char **)0x0);
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    break;
  case Char:
    __return_storage_ptr__ = (string *)operator_new(1);
    std::__cxx11::string::substr((ulong)&local_58,(ulong)data);
    prepare_string_to_read(&local_38,(db *)data,&local_58);
    *(char *)&(__return_storage_ptr__->_M_dataplus)._M_p = *local_38._M_dataplus._M_p;
    std::__cxx11::string::~string((string *)&local_38);
    this_00 = &local_58;
    goto LAB_00106b3b;
  case String:
    __return_storage_ptr__ = (string *)operator_new(0x20);
    std::__cxx11::string::substr((ulong)&sStack_78,(ulong)data);
    prepare_string_to_read(__return_storage_ptr__,(db *)data,&sStack_78);
LAB_00106b3b:
    std::__cxx11::string::~string((string *)this_00);
    break;
  default:
    __return_storage_ptr__ = (string *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

void * db::get_var_data(db_bit_type type, std::string data){
            switch(type){
                case Bool: return new bool(atoi(data.data())); break;
                case Int:  return new int(atoi(data.data())); break;
                case Long: return new long(atol(data.data())); break;
                case LongLong: return new long long(atoll(data.data())); break;
                case Float: return new float(atof(data.data())); break;
                case Double: return new double(strtod(data.data(), nullptr));
                case Char: return new char(prepare_string_to_read(data.substr(1, data.length()-2))[0]);       break;
                case String: return new std::string(prepare_string_to_read(data.substr(1, data.length()-2))); break;
                default: return nullptr;
            }
        }